

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O3

void __thiscall CT::PerformLabeling(CT *this)

{
  uint *puVar1;
  char cVar2;
  int *piVar3;
  Mat1i *pMVar4;
  ulong uVar5;
  uint i_label;
  Mat1b *pMVar6;
  int iVar7;
  bool b_external;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Mat aMStack_a8 [96];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  piVar3 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(aMStack_a8,*piVar3,piVar3[1],4);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  cv::Mat::operator=(aMStack_a8,(Scalar_ *)&local_48);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     aMStack_a8);
  cv::Mat::~Mat(aMStack_a8);
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  if (0 < *(int *)&pMVar6->field_0x8) {
    lVar11 = 0;
    do {
      uVar5 = (ulong)*(uint *)&pMVar6->field_0xc;
      if (0 < (int)*(uint *)&pMVar6->field_0xc) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar9 = **(long **)&pMVar4->field_0x48 * lVar11 + *(long *)&pMVar4->field_0x10;
        lVar10 = **(long **)&pMVar6->field_0x48 * lVar11 + *(long *)&pMVar6->field_0x10;
        lVar12 = 0;
        do {
          cVar2 = *(char *)(lVar10 + lVar12);
          if (cVar2 == (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
            i_label = *(uint *)(lVar9 + lVar12 * 4);
            iVar8 = (int)lVar12;
            if (i_label == 0) {
              if (lVar12 == 0) {
                i_label = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
                (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = i_label;
                iVar8 = 0;
              }
              else {
                if (*(char *)(lVar10 + -1 + lVar12) == cVar2) goto LAB_0018eb0d;
                i_label = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
                (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = i_label;
              }
              b_external = true;
            }
            else {
LAB_0018eb0d:
              if ((((int)uVar5 + -1 <= lVar12) || (*(char *)(lVar10 + 1 + lVar12) == cVar2)) ||
                 (*(int *)(lVar9 + 4 + lVar12 * 4) == -1)) {
                if (i_label == 0) {
                  *(undefined4 *)(lVar9 + lVar12 * 4) = *(undefined4 *)(lVar9 + -4 + lVar12 * 4);
                }
                goto LAB_0018eb82;
              }
              if (i_label == 0) {
                i_label = *(uint *)(lVar9 + -4 + lVar12 * 4);
              }
              b_external = false;
            }
            ContourTracing(this,iVar8,(int)lVar11,i_label,b_external);
          }
LAB_0018eb82:
          lVar12 = lVar12 + 1;
          pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
          uVar5 = (ulong)*(int *)&pMVar6->field_0xc;
        } while (lVar12 < (long)uVar5);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)&pMVar6->field_0x8);
  }
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar8 = *(int *)&pMVar4->field_0x8;
  if (0 < iVar8) {
    lVar11 = *(long *)&pMVar4->field_0x10;
    lVar9 = **(long **)&pMVar4->field_0x48;
    iVar7 = *(int *)&pMVar4->field_0xc;
    lVar10 = 0;
    do {
      if (0 < iVar7) {
        lVar12 = 0;
        do {
          if (*(int *)(lVar11 + lVar12 * 4) == -1) {
            *(undefined4 *)(lVar11 + lVar12 * 4) = 0;
            iVar7 = *(int *)&pMVar4->field_0xc;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar7);
        iVar8 = *(int *)&pMVar4->field_0x8;
      }
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + lVar9;
    } while (lVar10 < iVar8);
  }
  puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0);

        n_labels_ = 0;
        for (int y = 0; y < img_.rows; y++) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_out_row = img_labels_.ptr<unsigned int>(y);
            for (int x = 0; x < img_.cols; x++) {

                if (img_row[x] == byF) {
                    // Case 1
                    if (img_labels_out_row[x] == 0 && (x == 0 || img_row[x - 1] != byF)) {
                        n_labels_++;
                        ContourTracing(x, y, n_labels_, true);
                        continue;
                    }
                    // Case 2
                    else if (x < img_.cols - 1 && img_row[x + 1] != byF && img_labels_out_row[x + 1] != -1) {
                        if (img_labels_out_row[x] == 0) {
                            // Current pixel unlabeled
                            // Assing label of left pixel
                            ContourTracing(x, y, img_labels_out_row[x - 1], false);
                        }
                        else {
                            ContourTracing(x, y, img_labels_out_row[x], false);
                        }
                        continue;
                    }
                    // case 3
                    else if (img_labels_out_row[x] == 0) {
                        img_labels_out_row[x] = img_labels_out_row[x - 1];
                    }
                }
            }
        }

        // Reassign to contour background value (0)
        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            for (int c = 0; c < img_labels_.cols; ++c) {
                if (img_labels_row[c] == -1)
                    img_labels_row[c] = 0;
            }
        }

        n_labels_++; // To count also background label
    }